

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfusionstyle.cpp
# Opt level: O0

QLinearGradient * qt_fusion_gradient(QRect *rect,QBrush *baseColor,Direction direction)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  QColor *pQVar5;
  undefined4 in_ECX;
  QLinearGradient *in_RDI;
  long in_FS_OFFSET;
  undefined1 auVar6 [16];
  int y;
  int x;
  QLinearGradient *gradient;
  QColor gradientStopColor;
  QColor gradientStartColor;
  QLinearGradient *in_stack_fffffffffffffd98;
  QLinearGradient *in_stack_fffffffffffffda0;
  QLinearGradient *this;
  QRect *in_stack_fffffffffffffdc0;
  double dVar7;
  undefined2 uStack_1ba;
  undefined6 local_1b8;
  QLinearGradient local_198;
  QLinearGradient local_140;
  QLinearGradient local_e8;
  QLinearGradient local_90;
  QPoint local_38;
  QPoint local_30;
  undefined1 *local_28;
  undefined1 *puStack_20;
  undefined6 local_18;
  undefined2 uStack_12;
  undefined6 uStack_10;
  undefined2 uStack_a;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_30 = QRect::center(in_stack_fffffffffffffdc0);
  iVar1 = QPoint::x((QPoint *)0x4dfec3);
  local_38 = QRect::center(in_stack_fffffffffffffdc0);
  iVar2 = QPoint::y((QPoint *)0x4dfee9);
  *(undefined1 **)&(in_RDI->super_QGradient).m_coordinateMode = &DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->super_QGradient).m_data.radial.cradius = -NAN;
  (in_RDI->super_QGradient).m_data.radial.fradius = -NAN;
  (in_RDI->super_QGradient).m_data.linear.x2 = -NAN;
  (in_RDI->super_QGradient).m_data.linear.y2 = -NAN;
  (in_RDI->super_QGradient).m_data.linear.x1 = -NAN;
  (in_RDI->super_QGradient).m_data.linear.y1 = -NAN;
  (in_RDI->super_QGradient).m_stops.d.ptr = (pair<double,_QColor> *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->super_QGradient).m_stops.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)&in_RDI->super_QGradient = &DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->super_QGradient).m_stops.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  QLinearGradient::QLinearGradient(in_RDI);
  switch(in_ECX) {
  case 0:
  default:
    this = (QLinearGradient *)(double)iVar1;
    iVar2 = QRect::top((QRect *)0x4e00f5);
    iVar3 = QRect::bottom((QRect *)0x4e0118);
    QLinearGradient::QLinearGradient
              (&local_198,(double)this,(double)iVar2,(double)iVar1,(double)iVar3);
    QLinearGradient::operator=(this,in_stack_fffffffffffffd98);
    QLinearGradient::~QLinearGradient(&local_198);
    break;
  case 1:
    iVar1 = QRect::left((QRect *)0x4dff76);
    iVar3 = QRect::right((QRect *)0x4dff99);
    QLinearGradient::QLinearGradient
              (&local_90,(double)iVar1,(double)iVar2,(double)iVar3,(double)iVar2);
    QLinearGradient::operator=(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
    QLinearGradient::~QLinearGradient(&local_90);
    break;
  case 2:
    iVar2 = QRect::bottom((QRect *)0x4e0070);
    dVar7 = (double)iVar2;
    iVar2 = QRect::top((QRect *)0x4e0093);
    QLinearGradient::QLinearGradient(&local_140,(double)iVar1,dVar7,(double)iVar1,(double)iVar2);
    QLinearGradient::operator=(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
    QLinearGradient::~QLinearGradient(&local_140);
    break;
  case 3:
    iVar1 = QRect::right((QRect *)0x4dffed);
    iVar3 = QRect::left((QRect *)0x4e0010);
    QLinearGradient::QLinearGradient
              (&local_e8,(double)iVar1,(double)iVar2,(double)iVar3,(double)iVar2);
    QLinearGradient::operator=(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
    QLinearGradient::~QLinearGradient(&local_e8);
  }
  lVar4 = QBrush::gradient();
  if (lVar4 == 0) {
    local_18 = 0xaaaaaaaaaaaa;
    uStack_12 = 0xaaaa;
    uStack_10 = 0xaaaaaaaaaaaa;
    uStack_a = 0xaaaa;
    pQVar5 = QBrush::color((QBrush *)0x4e01ca);
    auVar6 = QColor::lighter((int)pQVar5);
    local_1b8 = auVar6._8_6_;
    uStack_1ba = auVar6._6_2_;
    uStack_10 = local_1b8;
    local_18 = auVar6._0_6_;
    local_28 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
    uStack_12 = uStack_1ba;
    pQVar5 = QBrush::color((QBrush *)0x4e0223);
    auVar6 = QColor::lighter((int)pQVar5);
    local_28 = auVar6._0_8_;
    puStack_20._0_6_ = auVar6._8_6_;
    QGradient::setColorAt(0.0,(QColor *)in_RDI);
    QGradient::setColorAt(1.0,(QColor *)in_RDI);
  }
  else {
    QBrush::gradient();
    QGradient::stops();
    QGradient::setStops((QList_conflict2 *)in_RDI);
    QList<std::pair<double,_QColor>_>::~QList((QList<std::pair<double,_QColor>_> *)0x4e01a9);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static QLinearGradient qt_fusion_gradient(const QRect &rect, const QBrush &baseColor, Direction direction = TopDown)
{
    int x = rect.center().x();
    int y = rect.center().y();
    QLinearGradient gradient;
    switch (direction) {
    case FromLeft:
        gradient = QLinearGradient(rect.left(), y, rect.right(), y);
        break;
    case FromRight:
        gradient = QLinearGradient(rect.right(), y, rect.left(), y);
        break;
    case BottomUp:
        gradient = QLinearGradient(x, rect.bottom(), x, rect.top());
        break;
    case TopDown:
    default:
        gradient = QLinearGradient(x, rect.top(), x, rect.bottom());
        break;
    }
    if (baseColor.gradient())
        gradient.setStops(baseColor.gradient()->stops());
    else {
        QColor gradientStartColor = baseColor.color().lighter(124);
        QColor gradientStopColor = baseColor.color().lighter(102);
        gradient.setColorAt(0, gradientStartColor);
        gradient.setColorAt(1, gradientStopColor);
        //          Uncomment for adding shiny shading
        //            QColor midColor1 = mergedColors(gradientStartColor, gradientStopColor, 55);
        //            QColor midColor2 = mergedColors(gradientStartColor, gradientStopColor, 45);
        //            gradient.setColorAt(0.5, midColor1);
        //            gradient.setColorAt(0.501, midColor2);
    }
    return gradient;
}